

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-fec.c
# Opt level: O1

int poc_encoder(int sock,sockaddr_in *saddr,char *filename)

{
  mp3_frame_t *pmVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  unsigned_short uVar5;
  int iVar6;
  uint len;
  uint uVar7;
  fec_t *fec;
  adu_t *paVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  ssize_t sVar12;
  int *piVar13;
  gf **src;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  gf *pgVar21;
  gf *__dest;
  gf agStack_5fb0 [8];
  gf agStack_5fa8 [8];
  unsigned_long uStack_5fa0;
  ulong uStack_5f98;
  long lStack_5f90;
  undefined1 local_5f88 [8];
  mp3_frame_t mp3_frame;
  aq_t adu_queue;
  file_t mp3_file;
  timeval tv;
  ulong local_70;
  ulong local_58;
  unsigned_long local_50;
  __time_t local_48;
  uint local_34;
  
  lStack_5f90 = 0x107de4;
  iVar6 = file_open_read((file_t *)&adu_queue.size,filename);
  if (iVar6 == 0) {
    iVar6 = 0;
    lStack_5f90 = 0x1084b8;
    fprintf(_stderr,"Could not open mp3 file: %s\n",filename);
  }
  else {
    lStack_5f90 = 0x107dff;
    fec = fec_new((uint)fec_k,(uint)fec_n);
    lStack_5f90 = 0x107e0f;
    aq_init((aq_t *)(mp3_frame.raw + 0xf98));
    lVar3 = -(ulong)((uint)fec_k * 8 + 0xf & 0xfffffff0);
    lVar4 = lVar3 + -0x5f88;
    *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x107e41;
    gettimeofday((timeval *)&mp3_file.pos,(__timezone_ptr_t)0x0);
    local_50 = mp3_file.pos;
    *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x107e5f;
    iVar6 = mp3_next_frame((file_t *)&adu_queue.size,(mp3_frame_t *)local_5f88);
    local_34 = 1;
    if (iVar6 < 1) {
      uVar14 = 0;
    }
    else {
      local_48 = tv.tv_sec;
      uVar14 = 0;
      if ((finished & 1) == 0) {
        local_34 = 1;
        uVar15 = 0;
        local_70 = 0;
        local_58 = 0;
        do {
          *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x107eb2;
          iVar6 = aq_add_frame((aq_t *)(mp3_frame.raw + 0xf98),(mp3_frame_t *)local_5f88);
          if (0 < iVar6) {
            *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x107ec2;
            paVar8 = aq_get_adu((aq_t *)(mp3_frame.raw + 0xf98));
            *(adu_t **)(local_5f88 + uVar15 * 8 + lVar4 + 0x5f88) = paVar8;
            if (paVar8 == (adu_t *)0x0) {
              *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x1084d9;
              __assert_fail("in_adus[cnt] != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c"
                            ,0x68,"int poc_encoder(int, struct sockaddr_in *, char *)");
            }
            uVar14 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar14;
            if (uVar14 == fec_k) {
              uVar14 = (uint)fec_k;
              if (fec_k == '\0') {
                uVar11 = 0;
                uVar20 = 0;
              }
              else {
                uVar16 = 0;
                uVar20 = 0;
                uVar9 = 0;
                do {
                  pmVar1 = *(mp3_frame_t **)(local_5f88 + uVar16 * 8 + lVar4 + 0x5f88);
                  *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x107f0d;
                  uVar10 = mp3_frame_size(pmVar1);
                  uVar11 = uVar10 & 0xffffffff;
                  if ((uint)uVar10 < (uint)uVar9) {
                    uVar11 = uVar9;
                  }
                  uVar20 = uVar20 + pmVar1->usec;
                  uVar16 = uVar16 + 1;
                  uVar14 = (uint)fec_k;
                  uVar9 = uVar11;
                } while (uVar16 < uVar14);
              }
              len = (uint)uVar11;
              if (0xfff0 < len) {
                *(code **)(local_5f88 + lVar3 + -8) = main;
                __assert_fail("max_len < FEC_PKT_PAYLOAD_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c"
                              ,0x7b,"int poc_encoder(int, struct sockaddr_in *, char *)");
              }
              src = (gf **)(local_5f88 + (lVar4 - (ulong)(uVar14 * 8 + 0xf & 0xfffffff0)) + 0x5f88);
              uVar14 = (uint)fec_k;
              uVar9 = (ulong)uVar14;
              pgVar21 = (gf *)((long)src - ((ulong)(len * uVar14) + 0xf & 0xfffffffffffffff0));
              if (uVar14 == 0) {
                uVar16 = 0;
              }
              else {
                uVar18 = 0;
                uVar16 = 0;
                __dest = pgVar21;
                do {
                  pmVar1 = *(mp3_frame_t **)(local_5f88 + uVar18 * 8 + lVar4 + 0x5f88);
                  pgVar21[-8] = 0xaf;
                  pgVar21[-7] = '\x7f';
                  pgVar21[-6] = '\x10';
                  pgVar21[-5] = '\0';
                  pgVar21[-4] = '\0';
                  pgVar21[-3] = '\0';
                  pgVar21[-2] = '\0';
                  pgVar21[-1] = '\0';
                  uVar10 = mp3_frame_size(pmVar1);
                  src[uVar18] = __dest;
                  pgVar21[-8] = 0xd2;
                  pgVar21[-7] = '\x7f';
                  pgVar21[-6] = '\x10';
                  pgVar21[-5] = '\0';
                  pgVar21[-4] = '\0';
                  pgVar21[-3] = '\0';
                  pgVar21[-2] = '\0';
                  pgVar21[-1] = '\0';
                  memcpy(__dest,pmVar1->raw,uVar10 & 0xffffffff);
                  uVar14 = len - (uint)uVar10;
                  if ((uint)uVar10 <= len && uVar14 != 0) {
                    pgVar21[-8] = 0xe7;
                    pgVar21[-7] = '\x7f';
                    pgVar21[-6] = '\x10';
                    pgVar21[-5] = '\0';
                    pgVar21[-4] = '\0';
                    pgVar21[-3] = '\0';
                    pgVar21[-2] = '\0';
                    pgVar21[-1] = '\0';
                    memset(__dest + (uVar10 & 0xffffffff),0,(ulong)uVar14);
                  }
                  uVar16 = uVar16 + pmVar1->bitrate;
                  __dest = __dest + uVar11;
                  uVar18 = uVar18 + 1;
                  uVar9 = (ulong)fec_k;
                } while (uVar18 < uVar9);
              }
              local_70 = local_70 + uVar20;
              uVar18 = (ulong)fec_n;
              if (fec_n != '\0') {
                uVar19 = 0;
                do {
                  pkt.hdr.packet_seq = (uchar)uVar19;
                  pkt.hdr.fec_k = fec_k;
                  pkt.hdr.fec_n = (uchar)uVar18;
                  pgVar21[-8] = 0xb1;
                  pgVar21[-7] = 0x80;
                  pgVar21[-6] = '\x10';
                  pgVar21[-5] = '\0';
                  pgVar21[-4] = '\0';
                  pgVar21[-3] = '\0';
                  pgVar21[-2] = '\0';
                  pgVar21[-1] = '\0';
                  pkt.hdr.fec_len = (unsigned_short)uVar11 + 2;
                  pkt.hdr.group_tstamp = local_70;
                  fec_encode(fec,src,pkt.payload,(uint)uVar19,len);
                  uVar5 = (unsigned_short)uVar11;
                  if (uVar19 < fec_k) {
                    pmVar1 = *(mp3_frame_t **)(local_5f88 + uVar19 * 8 + lVar4 + 0x5f88);
                    builtin_memcpy(pgVar21 + -8,"̀\x10",4);
                    pgVar21[-4] = '\0';
                    pgVar21[-3] = '\0';
                    pgVar21[-2] = '\0';
                    pgVar21[-1] = '\0';
                    uVar10 = mp3_frame_size(pmVar1);
                    uVar5 = (unsigned_short)uVar10;
                  }
                  pgVar21[-8] = 0xef;
                  pgVar21[-7] = 0x80;
                  pgVar21[-6] = '\x10';
                  pgVar21[-5] = '\0';
                  pgVar21[-4] = '\0';
                  pgVar21[-3] = '\0';
                  pgVar21[-2] = '\0';
                  pgVar21[-1] = '\0';
                  pkt.hdr.len = uVar5;
                  sVar12 = fec_pkt_sendto(&pkt,sock,(sockaddr *)saddr,0x10);
                  if (sVar12 < 0) {
                    builtin_memcpy(pgVar21 + -8,"ց\x10",4);
                    pgVar21[-4] = '\0';
                    pgVar21[-3] = '\0';
                    pgVar21[-2] = '\0';
                    pgVar21[-1] = '\0';
                    piVar13 = __errno_location();
                    if (*piVar13 != 0x69) {
                      pgVar21[-8] = '\x1e';
                      pgVar21[-7] = 0x84;
                      pgVar21[-6] = '\x10';
                      pgVar21[-5] = '\0';
                      pgVar21[-4] = '\0';
                      pgVar21[-3] = '\0';
                      pgVar21[-2] = '\0';
                      pgVar21[-1] = '\0';
                      perror("Error while sending packet");
                      local_34 = 0;
                      iVar6 = 0xd;
                      goto LAB_001083d7;
                    }
                    pgVar21[-8] = 0xe4;
                    pgVar21[-7] = 0x81;
                    pgVar21[-6] = '\x10';
                    pgVar21[-5] = '\0';
                    pgVar21[-4] = '\0';
                    pgVar21[-3] = '\0';
                    pgVar21[-2] = '\0';
                    pgVar21[-1] = '\0';
                    poc_encoder_cold_1();
                  }
                  uVar18 = (ulong)fec_n;
                  poc_encoder::wait_time = poc_encoder::wait_time + uVar20 / uVar18;
                  if (1000 < poc_encoder::wait_time) {
                    pgVar21[-8] = ')';
                    pgVar21[-7] = 0x81;
                    pgVar21[-6] = '\x10';
                    pgVar21[-5] = '\0';
                    pgVar21[-4] = '\0';
                    pgVar21[-3] = '\0';
                    pgVar21[-2] = '\0';
                    pgVar21[-1] = '\0';
                    usleep((__useconds_t)poc_encoder::wait_time);
                  }
                  local_58 = uVar20 / uVar18 + local_58;
                  if ((quiet == 0) &&
                     (uVar14 = poc_encoder::count + 1, uVar7 = poc_encoder::count * -0x33333333,
                     poc_encoder::count = uVar14,
                     (uVar7 >> 1 | (uint)((uVar7 & 1) != 0) << 0x1f) < 0x1999999a)) {
                    uVar18 = (local_58 / 1000000) % 0x3c;
                    if (mp3_file.offset == 0) {
                      pgVar21[-8] = '\x05';
                      pgVar21[-7] = 0x82;
                      pgVar21[-6] = '\x10';
                      pgVar21[-5] = '\0';
                      pgVar21[-4] = '\0';
                      pgVar21[-3] = '\0';
                      pgVar21[-2] = '\0';
                      pgVar21[-1] = '\0';
                      fprintf(_stdout,"\r%02ld:%02ld %ld %3ldkbit/s ",local_58 / 60000000,uVar18,
                              mp3_file._0_8_,uVar16 / uVar9);
                    }
                    else {
                      lVar17 = (long)(((float)(local_70 / 1000) /
                                      ((float)(ulong)mp3_file._0_8_ + 1.0)) * (float)mp3_file.offset
                                     );
                      *(long *)(pgVar21 + -8) =
                           (long)(((float)(ulong)mp3_file._0_8_ * 100.0) / (float)mp3_file.offset);
                      *(ulong *)(pgVar21 + -0x10) = uVar16 / uVar9;
                      *(unsigned_long *)(pgVar21 + -0x18) = mp3_file.offset;
                      *(undefined8 *)(pgVar21 + -0x20) = mp3_file._0_8_;
                      pgVar21[-0x28] = 0xf5;
                      pgVar21[-0x27] = 0x82;
                      pgVar21[-0x26] = '\x10';
                      pgVar21[-0x25] = '\0';
                      pgVar21[-0x24] = '\0';
                      pgVar21[-0x23] = '\0';
                      pgVar21[-0x22] = '\0';
                      pgVar21[-0x21] = '\0';
                      fprintf(_stdout,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                              local_58 / 60000000,uVar18,lVar17 / 60000,(lVar17 / 1000) % 0x3c);
                    }
                    pgVar21[-8] = '\b';
                    pgVar21[-7] = 0x83;
                    pgVar21[-6] = '\x10';
                    pgVar21[-5] = '\0';
                    pgVar21[-4] = '\0';
                    pgVar21[-3] = '\0';
                    pgVar21[-2] = '\0';
                    pgVar21[-1] = '\0';
                    fflush(_stdout);
                  }
                  pgVar21[-8] = '\x16';
                  pgVar21[-7] = 0x83;
                  pgVar21[-6] = '\x10';
                  pgVar21[-5] = '\0';
                  pgVar21[-4] = '\0';
                  pgVar21[-3] = '\0';
                  pgVar21[-2] = '\0';
                  pgVar21[-1] = '\0';
                  gettimeofday((timeval *)&mp3_file.pos,(__timezone_ptr_t)0x0);
                  poc_encoder::wait_time =
                       (local_48 - tv.tv_sec) + (mp3_file.pos - local_50) * -1000000 +
                       poc_encoder::wait_time;
                  uVar7 = (uint)poc_encoder::wait_time;
                  uVar14 = -uVar7;
                  if (0 < (int)uVar7) {
                    uVar14 = uVar7;
                  }
                  if (1000000 < uVar14) {
                    poc_encoder::wait_time = 0;
                  }
                  uVar19 = uVar19 + 1;
                  uVar18 = (ulong)fec_n;
                  local_50 = mp3_file.pos;
                  local_48 = tv.tv_sec;
                } while (uVar19 < uVar18);
              }
              pkt.hdr.group_seq = pkt.hdr.group_seq + '\x01';
              uVar15 = 0;
              if (fec_k == '\0') {
                iVar6 = 0;
              }
              else {
                uVar15 = 0;
                do {
                  pvVar2 = *(void **)(local_5f88 + uVar15 * 8 + lVar4 + 0x5f88);
                  pgVar21[-8] = 0xa4;
                  pgVar21[-7] = 0x83;
                  pgVar21[-6] = '\x10';
                  pgVar21[-5] = '\0';
                  pgVar21[-4] = '\0';
                  pgVar21[-3] = '\0';
                  pgVar21[-2] = '\0';
                  pgVar21[-1] = '\0';
                  free(pvVar2);
                  uVar15 = uVar15 + 1;
                } while (uVar15 < fec_k);
                iVar6 = 0;
                uVar15 = 0;
              }
LAB_001083d7:
              uVar14 = (uint)uVar15;
              if (iVar6 != 0) {
                if (iVar6 != 0xd) goto LAB_0010847f;
                break;
              }
            }
          }
          uVar14 = (uint)uVar15;
          *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x1083ff;
          iVar6 = mp3_next_frame((file_t *)&adu_queue.size,(mp3_frame_t *)local_5f88);
          if ((iVar6 < 1) || ((finished & 1) != 0)) break;
        } while( true );
      }
    }
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        pvVar2 = *(void **)(local_5f88 + uVar15 * 8 + lVar4 + 0x5f88);
        *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x108452;
        free(pvVar2);
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x108466;
    aq_destroy((aq_t *)(mp3_frame.raw + 0xf98));
    *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x10846f;
    fec_free(fec);
    *(undefined8 *)(local_5f88 + lVar3 + -8) = 0x10847b;
    file_close((file_t *)&adu_queue.size);
    local_58 = (ulong)local_34;
LAB_0010847f:
    iVar6 = (int)local_58;
  }
  return iVar6;
}

Assistant:

int poc_encoder(int sock, struct sockaddr_in *saddr, char *filename) {
  int retval = 1;
  
  /*M
    Open file for reading.
  **/
  file_t mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  /*M
    Initialize the FEC parameters.
  **/
  fec_t *fec = fec_new(fec_k, fec_n);

  aq_t adu_queue;
  aq_init(&adu_queue);

  adu_t *in_adus[fec_k];
  unsigned int cnt = 0;

  static long wait_time = 0;
  unsigned long fec_time = 0;
  unsigned long fec_time2 = 0;

  /*M
    Get start time.
  **/
  struct timeval tv;
  gettimeofday(&tv, NULL);
  unsigned long start_sec, start_usec;
  start_sec = tv.tv_sec;
  start_usec = tv.tv_usec;
  
  /*M
    Get next MP3 frame and queue it into the ADU queue.
  **/
  mp3_frame_t mp3_frame;
  while ((mp3_next_frame(&mp3_file, &mp3_frame) > 0) && !finished) {
    if (aq_add_frame(&adu_queue, &mp3_frame) > 0) {
      /* a new ADU has been produced */
      in_adus[cnt] = aq_get_adu(&adu_queue);
      assert(in_adus[cnt] != NULL);

      /* check if the FEC group is complete */
      if (++cnt == fec_k) {
        unsigned int max_len = 0;
        unsigned long group_duration = 0;

        int i;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          if (adu_len > max_len)
            max_len = adu_len;

          group_duration += in_adus[i]->usec;
        }

        fec_time += group_duration;

        assert(max_len < FEC_PKT_PAYLOAD_SIZE);

        /* Encode the FEC group */
        unsigned char *in_ptrs[fec_k];
        unsigned char buf[fec_k * max_len];
        unsigned char *ptr = buf;
        unsigned long bitrate = 0;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          in_ptrs[i] = ptr;
          memcpy(ptr, in_adus[i]->raw, adu_len);
          if (adu_len < max_len)
            memset(ptr + adu_len, 0, max_len - adu_len);
          ptr += max_len;
          bitrate += in_adus[i]->bitrate;
        }
        bitrate /= fec_k;

        for (i = 0; i < fec_n; i++) {
          pkt.hdr.packet_seq = i;
          pkt.hdr.fec_k = fec_k;
          pkt.hdr.fec_n = fec_n;
          pkt.hdr.fec_len = max_len + 2;
          pkt.hdr.group_tstamp = fec_time;
          
          fec_encode(fec, in_ptrs, pkt.payload, i, max_len);

          if (i < fec_k) {
            pkt.hdr.len = mp3_frame_size(in_adus[i]);
          } else {
            pkt.hdr.len = max_len;
          }

          /*M
            Simulate packet loss.
          **/
#ifdef DEBUG_PLOSS
          if ((random() % 100) >= ploss_rate ) {
#endif /* DEBUG_PLOSS */

#ifdef DEBUG
            fprintf(stderr,
                    "sending fec packet group stamp %ld, gseq %d, pseq %d, size %d\n",
                    pkt.hdr.group_tstamp, pkt.hdr.group_seq, pkt.hdr.packet_seq, pkt.hdr.len);
#endif
            
            /* send rtp packet */
            if (fec_pkt_sendto(&pkt, sock, (struct sockaddr *)saddr, sizeof(*saddr)) < 0) {
              if (errno == ENOBUFS) {
		fprintf(stderr, "Output buffers full, waiting...\n");
	      } else {
                perror("Error while sending packet");
                
                retval = 0;
                goto exit;
              }
            }
#ifdef DEBUG_PLOSS
          }
#endif /* DEBUG_PLOSS */

          /*M
            Update the time we have to wait.
          **/
          wait_time += (group_duration / fec_n);
          fec_time2 += (group_duration / fec_n);

          /*M
            Sender synchronisation (\verb|sleep| until the next
            packet has to be sent.
          **/
          if (wait_time > 1000)
            usleep(wait_time);

          if (!quiet) {        
            static unsigned int count = 0;
            if ((count++ % 10) == 0) {
              if (mp3_file.size > 0) {
                fprintf(stdout,
                        "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        60000,
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        1000 % 60,
                        
                        mp3_file.offset,
                        mp3_file.size,

                        bitrate,
                        
                        (long)(100*(float)mp3_file.offset/(float)mp3_file.size));
              } else {
                fprintf(stdout, "\r%02ld:%02ld %ld %3ldkbit/s ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        mp3_file.offset,
                        bitrate);
              }
              fflush(stdout);
            }
          }
          
          /*M
            Get length of iteration.
          **/
          gettimeofday(&tv, NULL);
          unsigned long len =
            (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);
          
          wait_time -= len;
          if (abs(wait_time) > MAX_WAIT_TIME)
            wait_time = 0;

          start_sec = tv.tv_sec;
          start_usec = tv.tv_usec;
        }

        pkt.hdr.group_seq++;

        for (i = 0; i < fec_k; i++)
          free(in_adus[i]);

        cnt = 0;
      }
    }
  }

  int i;
 exit:
  for (i = 0; i < cnt; i++)
    free(in_adus[i]);
  
  aq_destroy(&adu_queue);
  fec_free(fec);

  file_close(&mp3_file);

  return retval;
}

/*M
  \emph{Print usage information.}
**/
static void usage(void) {
  fprintf(stderr,
          "Usage: ./poc-fec [-s address] [-p port] [-k fec_k] [-n fec_n] [-q] [-t ttl]");
#ifdef WITH_IPV6
  fprintf(stderr, " [-6]");
#endif /* WITH_IPV6 */
  fprintf(stderr, " files...\n");
  fprintf(stderr, "\t-s address : destination address (default 224.0.1.23 or ff02::4)\n");
  fprintf(stderr, "\t-p port    : destination port (default 1500)\n");
  fprintf(stderr, "\t-q         : quiet\n");
  fprintf(stderr, "\t-t ttl     : multicast ttl (default 1)\n");
  fprintf(stderr, "\t-k fec_k   : FEC k parameter (default 20)\n");
  fprintf(stderr, "\t-n fec_n   : FEC n parameter (default 25)\n");
#ifdef WITH_IPV6
  fprintf(stderr, "\t-6         : use ipv6\n");
#endif /* WITH_IPV6 */
}

/*M
  \emph{Main server routine.}

  Calls the mainloop for each filename given on the command line.
**/
int main(int argc, char *argv[]) {
  int retval = 0;

  char           *address = NULL;
  unsigned short port     = 1500;
  unsigned int   ttl      = 1;

  /*M
    Process the command line arguments.
  **/
  int c;
  while ((c = getopt(argc, argv, "hs:p:t:qP:k:n:"
#ifdef WITH_IPV6
                     "6"
#endif /* WITH_IPV6 */
                     )) >= 0) {
    switch (c) {
#ifdef WITH_IPV6
    case '6':
      use_ipv6 = 1;
      break;
#endif /* WITH_IPV6 */
      
    case 's':
      if (address != NULL)
        free(address);

      address = strdup(optarg);
      break;

    case 'p':
      port = (unsigned short)atoi(optarg);
      break;

    case 'q':
      quiet = 1;
      break;

    case 't':
      ttl = (unsigned int)atoi(optarg);
      break;

    case 'k':
      fec_k = (unsigned int)atoi(optarg);
      break;

    case 'n':
      fec_n = (unsigned int)atoi(optarg);
      break;
      
#ifdef DEBUG_PLOSS
    case 'P':
      {
        static struct timeval tv;
        gettimeofday(&tv, NULL);
        srandom(tv.tv_sec);
        ploss_rate = atoi(optarg);
        break;
      }
#endif /* DEBUG_PLOSS */

    case 'h':
    default:
      usage();
      retval = EXIT_FAILURE;
      goto exit;
    }
  }

  if (fec_n <= fec_k) {
    fprintf(stderr, "fec_n must be bigger than fec_k\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (optind == argc) {
    usage();
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (address == NULL) {
#ifdef WITH_IPV6
    if (use_ipv6)
      address = strdup("ff02::4");
    else
      address = strdup("224.0.1.23");
#else
    address = strdup("224.0.1.23");
#endif /* WITH_IPV6 */
  }

  if (sig_set_handler(SIGINT, sig_int) == SIG_ERR) {
    retval = EXIT_FAILURE;
    goto exit;
  }

  /*M
    Open the sending socket.
  **/
  int sock;
  struct sockaddr_in saddr;
  if (!net_ip4_resolve_hostname(address, port, NULL, &saddr)) {
    fprintf(stderr, "Could not resolve %s\n", address);
    retval = EXIT_FAILURE;
    goto exit;
  }

  sock  = net_udp4_socket(&saddr, port, ttl);
  if (sock < 0) {
    fprintf(stderr, "Could not open socket\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  fec_pkt_init(&pkt);
  
  /*M
    Go through all files given on command line and stream them.
  **/
  int i;
  for (i = optind; (i < argc) && !finished; i++) {
    assert(argv[i] != NULL);
    char filename[MAX_FILENAME];
    strncpy(filename, argv[i], MAX_FILENAME - 1);
    filename[MAX_FILENAME - 1] = '\0';
    
    if (!poc_encoder(sock, &saddr, filename))
      continue;
  }
  
 exit:
  if (address != NULL)
    free(address);
  
  return retval;
}

/*M
 */